

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

char * get_hostname(void)

{
  int iVar1;
  char *__name;
  int *piVar2;
  size_t sVar3;
  size_t size;
  size_t local_18;
  
  local_18 = 0;
  __name = (char *)0x0;
  while( true ) {
    __name = (char *)safegrowarray(__name,&local_18,1,local_18,1,false);
    iVar1 = gethostname(__name,local_18);
    if ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 != 0x24)) break;
    sVar3 = strlen(__name);
    if (sVar3 < local_18 - 1) {
      return __name;
    }
  }
  safefree(__name);
  return (char *)0x0;
}

Assistant:

char *get_hostname(void)
{
    size_t size = 0;
    char *hostname = NULL;
    do {
        sgrowarray(hostname, size, size);
        if ((gethostname(hostname, size) < 0) && (errno != ENAMETOOLONG)) {
            sfree(hostname);
            hostname = NULL;
            break;
        }
    } while (strlen(hostname) >= size-1);
    return hostname;
}